

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_want_write(nghttp2_session *session)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  if ((session->goaway_flags & 2) == 0) {
    uVar2 = 1;
    if ((((session->aob).item == (nghttp2_outbound_item *)0x0) &&
        ((session->ob_urgent).head == (nghttp2_outbound_item *)0x0)) &&
       ((session->ob_reg).head == (nghttp2_outbound_item *)0x0)) {
      iVar1 = nghttp2_pq_empty(&(session->root).obq);
      if (iVar1 != 0) {
        lVar3 = 0;
        do {
          if (lVar3 + 0x28 == 0x168) goto LAB_0010fcbe;
          iVar1 = nghttp2_pq_empty((nghttp2_pq *)((long)&session->sched[0].ob_data.q + lVar3));
          lVar3 = lVar3 + 0x28;
        } while (iVar1 != 0);
      }
      if (session->remote_window_size < 1) {
LAB_0010fcbe:
        uVar2 = 0;
        if ((session->ob_syn).head != (nghttp2_outbound_item *)0x0) {
          uVar2 = (uint)(session->num_outgoing_streams <
                        (ulong)(session->remote_settings).max_concurrent_streams);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int nghttp2_session_want_write(nghttp2_session *session) {
  /* If these flag is set, we don't want to write any data. The
     application should drop the connection. */
  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_SENT) {
    return 0;
  }

  /*
   * Unless termination GOAWAY is sent or received, we want to write
   * frames if there is pending ones. If pending frame is request/push
   * response HEADERS and concurrent stream limit is reached, we don't
   * want to write them.
   */
  return session->aob.item || nghttp2_outbound_queue_top(&session->ob_urgent) ||
         nghttp2_outbound_queue_top(&session->ob_reg) ||
         ((!nghttp2_pq_empty(&session->root.obq) ||
           !session_sched_empty(session)) &&
          session->remote_window_size > 0) ||
         (nghttp2_outbound_queue_top(&session->ob_syn) &&
          !session_is_outgoing_concurrent_streams_max(session));
}